

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O0

oonf_subsystem * oonf_cfg_load_subsystem(char *name)

{
  avl_node *local_40;
  oonf_subsystem *plugin;
  char *name_local;
  
  local_40 = avl_find(&oonf_plugin_tree,name);
  if (local_40 == (avl_node *)0x0) {
    local_40 = (avl_node *)0x0;
  }
  else {
    local_40 = local_40 + -2;
  }
  if (local_40 == (avl_node *)0x0) {
    name_local = (char *)oonf_subsystem_load(name);
    if ((oonf_subsystem *)name_local != (oonf_subsystem *)0x0) {
      oonf_subsystem_configure(&_oonf_schema,(oonf_subsystem *)name_local);
    }
  }
  else {
    name_local = (char *)local_40;
  }
  return (oonf_subsystem *)name_local;
}

Assistant:

struct oonf_subsystem *
oonf_cfg_load_subsystem(const char *name) {
  struct oonf_subsystem *plugin;

  plugin = oonf_subsystem_get(name);
  if (plugin) {
    /* already loaded */
    return plugin;
  }

  plugin = oonf_subsystem_load(name);
  if (plugin) {
    oonf_subsystem_configure(&_oonf_schema, plugin);
  }
  return plugin;
}